

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selu_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::SELU_x86_avx512::forward_inplace(SELU_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  ulong uVar13;
  int iVar14;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ulong uVar15;
  undefined1 (*pauVar16) [64];
  int iVar17;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar18 [16];
  undefined1 auVar23 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  float fVar41;
  undefined1 extraout_var [60];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float afVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float afVar52 [16];
  float afVar53 [16];
  float afVar54 [16];
  float afVar55 [16];
  float afVar56 [16];
  float afVar57 [16];
  float afVar58 [16];
  undefined1 in_ZMM21 [64];
  undefined1 auVar59 [64];
  undefined1 in_ZMM22 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [32];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar29 [32];
  
  iVar14 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  auVar30 = vbroadcastss_avx512f(ZEXT416(0x80000000));
  auVar31 = vxorps_avx512dq(auVar30,(undefined1  [64])::_ps512_cephes_exp_C1);
  auVar30 = vxorps_avx512dq(auVar30,(undefined1  [64])::_ps512_cephes_exp_C2);
  auVar32 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
  uVar15 = 0;
  uVar13 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar13 = uVar15;
  }
  auVar33 = vbroadcastss_avx512f(ZEXT416(0xbf800000));
  auVar18 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
  auVar59 = ZEXT1664(auVar18);
  auVar18 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
  auVar60 = ZEXT1664(auVar18);
  auVar23 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
  auVar61 = ZEXT3264(auVar23);
  auVar23 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
  auVar62 = ZEXT3264(auVar23);
  auVar23 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar63 = ZEXT3264(auVar23);
  auVar23 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
  auVar64 = ZEXT3264(auVar23);
  auVar23 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar66 = ZEXT3264(auVar23);
  auVar23 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
  auVar67 = ZEXT3264(auVar23);
  auVar23 = vbroadcastss_avx512vl(ZEXT416(0x395e8083));
  auVar68 = ZEXT3264(auVar23);
  auVar23 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
  auVar69 = ZEXT3264(auVar23);
  auVar23 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
  auVar70 = ZEXT3264(auVar23);
  afVar49 = ::_ps512_1;
  afVar52 = ::_ps512_cephes_LOG2EF;
  afVar53 = ::_ps512_cephes_exp_p5;
  afVar54 = ::_ps512_cephes_exp_p0;
  afVar55 = ::_ps512_cephes_exp_p1;
  afVar56 = ::_ps512_cephes_exp_p2;
  afVar57 = ::_ps512_cephes_exp_p3;
  afVar58 = ::_ps512_cephes_exp_p4;
  for (; uVar15 != uVar13; uVar15 = uVar15 + 1) {
    pauVar16 = (undefined1 (*) [64])
               (bottom_top_blob->cstep * uVar15 * bottom_top_blob->elemsize +
               (long)bottom_top_blob->data);
    auVar34 = vbroadcastss_avx512f(ZEXT416((uint)(this->super_SELU).alpha));
    auVar35 = vbroadcastss_avx512f(ZEXT416((uint)(this->super_SELU).lambda));
    for (iVar17 = 0; iVar17 + 0xf < iVar14; iVar17 = iVar17 + 0x10) {
      auVar36 = vmaxps_avx512f(*pauVar16,auVar59);
      auVar37 = vminps_avx512f(*pauVar16,auVar59);
      auVar37 = vminps_avx512f(auVar37,(undefined1  [64])::_ps512_exp_hi);
      auVar37 = vmaxps_avx512f(auVar37,(undefined1  [64])::_ps512_exp_lo);
      auVar38 = vfmadd213ps_avx512f((undefined1  [64])afVar52,auVar37,(undefined1  [64])afVar53);
      auVar39 = vrndscaleps_avx512f(auVar38,1);
      uVar4 = vcmpps_avx512f(auVar38,auVar39,1);
      auVar38 = vsubps_avx512f(auVar39,(undefined1  [64])afVar49);
      bVar3 = (bool)((byte)uVar4 & 1);
      auVar40._0_4_ = (uint)bVar3 * auVar38._0_4_ | (uint)!bVar3 * auVar39._0_4_;
      bVar3 = (bool)((byte)(uVar4 >> 1) & 1);
      auVar40._4_4_ = (uint)bVar3 * auVar38._4_4_ | (uint)!bVar3 * auVar39._4_4_;
      bVar3 = (bool)((byte)(uVar4 >> 2) & 1);
      auVar40._8_4_ = (uint)bVar3 * auVar38._8_4_ | (uint)!bVar3 * auVar39._8_4_;
      bVar3 = (bool)((byte)(uVar4 >> 3) & 1);
      auVar40._12_4_ = (uint)bVar3 * auVar38._12_4_ | (uint)!bVar3 * auVar39._12_4_;
      bVar3 = (bool)((byte)(uVar4 >> 4) & 1);
      auVar40._16_4_ = (uint)bVar3 * auVar38._16_4_ | (uint)!bVar3 * auVar39._16_4_;
      bVar3 = (bool)((byte)(uVar4 >> 5) & 1);
      auVar40._20_4_ = (uint)bVar3 * auVar38._20_4_ | (uint)!bVar3 * auVar39._20_4_;
      bVar3 = (bool)((byte)(uVar4 >> 6) & 1);
      auVar40._24_4_ = (uint)bVar3 * auVar38._24_4_ | (uint)!bVar3 * auVar39._24_4_;
      bVar3 = (bool)((byte)(uVar4 >> 7) & 1);
      auVar40._28_4_ = (uint)bVar3 * auVar38._28_4_ | (uint)!bVar3 * auVar39._28_4_;
      bVar3 = (bool)((byte)(uVar4 >> 8) & 1);
      auVar40._32_4_ = (uint)bVar3 * auVar38._32_4_ | (uint)!bVar3 * auVar39._32_4_;
      bVar3 = (bool)((byte)(uVar4 >> 9) & 1);
      auVar40._36_4_ = (uint)bVar3 * auVar38._36_4_ | (uint)!bVar3 * auVar39._36_4_;
      bVar3 = (bool)((byte)(uVar4 >> 10) & 1);
      auVar40._40_4_ = (uint)bVar3 * auVar38._40_4_ | (uint)!bVar3 * auVar39._40_4_;
      bVar3 = (bool)((byte)(uVar4 >> 0xb) & 1);
      auVar40._44_4_ = (uint)bVar3 * auVar38._44_4_ | (uint)!bVar3 * auVar39._44_4_;
      bVar3 = (bool)((byte)(uVar4 >> 0xc) & 1);
      auVar40._48_4_ = (uint)bVar3 * auVar38._48_4_ | (uint)!bVar3 * auVar39._48_4_;
      bVar3 = (bool)((byte)(uVar4 >> 0xd) & 1);
      auVar40._52_4_ = (uint)bVar3 * auVar38._52_4_ | (uint)!bVar3 * auVar39._52_4_;
      bVar3 = (bool)((byte)(uVar4 >> 0xe) & 1);
      auVar40._56_4_ = (uint)bVar3 * auVar38._56_4_ | (uint)!bVar3 * auVar39._56_4_;
      bVar3 = SUB81(uVar4 >> 0xf,0);
      auVar40._60_4_ = (uint)bVar3 * auVar38._60_4_ | (uint)!bVar3 * auVar39._60_4_;
      auVar37 = vfmadd231ps_avx512f(auVar37,auVar40,auVar31);
      auVar37 = vfmadd231ps_avx512f(auVar37,auVar40,auVar30);
      auVar38 = vmulps_avx512f(auVar37,auVar37);
      auVar39 = vfmadd213ps_avx512f(auVar37,(undefined1  [64])afVar54,(undefined1  [64])afVar55);
      auVar39 = vfmadd213ps_avx512f(auVar39,auVar37,(undefined1  [64])afVar56);
      auVar39 = vfmadd213ps_avx512f(auVar39,auVar37,(undefined1  [64])afVar57);
      auVar39 = vfmadd213ps_avx512f(auVar39,auVar37,(undefined1  [64])afVar58);
      auVar39 = vfmadd213ps_avx512f(auVar39,auVar37,(undefined1  [64])afVar53);
      auVar37 = vfmadd213ps_avx512f(auVar39,auVar38,auVar37);
      auVar37 = vaddps_avx512f(auVar37,(undefined1  [64])afVar49);
      auVar38 = vcvttps2dq_avx512f(auVar40);
      auVar38 = vpaddd_avx512f(auVar32,auVar38);
      auVar38 = vpslld_avx512f(auVar38,0x17);
      auVar37 = vfmadd213ps_avx512f(auVar38,auVar37,auVar33);
      auVar36 = vfmadd213ps_avx512f(auVar37,auVar34,auVar36);
      auVar36 = vmulps_avx512f(auVar36,auVar35);
      *pauVar16 = auVar36;
      pauVar16 = pauVar16 + 1;
    }
    fVar1 = (this->super_SELU).alpha;
    auVar23._4_4_ = fVar1;
    auVar23._0_4_ = fVar1;
    auVar23._8_4_ = fVar1;
    auVar23._12_4_ = fVar1;
    auVar23._16_4_ = fVar1;
    auVar23._20_4_ = fVar1;
    auVar23._24_4_ = fVar1;
    auVar23._28_4_ = fVar1;
    fVar1 = (this->super_SELU).lambda;
    for (; iVar17 + 7 < iVar14; iVar17 = iVar17 + 8) {
      auVar24 = vmaxps_avx512vl(*(undefined1 (*) [32])*pauVar16,auVar60._0_32_);
      auVar25 = vminps_avx512vl(*(undefined1 (*) [32])*pauVar16,auVar60._0_32_);
      auVar25 = vminps_avx512vl(auVar25,auVar61._0_32_);
      auVar26 = vmaxps_avx512vl(auVar25,auVar62._0_32_);
      auVar27 = vfmadd231ps_avx512vl(auVar63._0_32_,auVar26,auVar64._0_32_);
      auVar25 = vroundps_avx(auVar27,1);
      uVar4 = vcmpps_avx512vl(auVar27,auVar25,1);
      auVar65 = auVar66._0_32_;
      auVar28 = vsubps_avx512vl(auVar25,auVar65);
      bVar3 = (bool)((byte)uVar4 & 1);
      auVar29._0_4_ = (float)((uint)bVar3 * auVar28._0_4_ | (uint)!bVar3 * auVar25._0_4_);
      bVar3 = (bool)((byte)(uVar4 >> 1) & 1);
      auVar29._4_4_ = (float)((uint)bVar3 * auVar28._4_4_ | (uint)!bVar3 * auVar25._4_4_);
      bVar3 = (bool)((byte)(uVar4 >> 2) & 1);
      auVar29._8_4_ = (float)((uint)bVar3 * auVar28._8_4_ | (uint)!bVar3 * auVar25._8_4_);
      bVar3 = (bool)((byte)(uVar4 >> 3) & 1);
      auVar29._12_4_ = (float)((uint)bVar3 * auVar28._12_4_ | (uint)!bVar3 * auVar25._12_4_);
      bVar3 = (bool)((byte)(uVar4 >> 4) & 1);
      auVar29._16_4_ = (float)((uint)bVar3 * auVar28._16_4_ | (uint)!bVar3 * auVar25._16_4_);
      bVar3 = (bool)((byte)(uVar4 >> 5) & 1);
      auVar29._20_4_ = (float)((uint)bVar3 * auVar28._20_4_ | (uint)!bVar3 * auVar25._20_4_);
      bVar3 = (bool)((byte)(uVar4 >> 6) & 1);
      auVar29._24_4_ = (float)((uint)bVar3 * auVar28._24_4_ | (uint)!bVar3 * auVar25._24_4_);
      bVar3 = SUB81(uVar4 >> 7,0);
      auVar29._28_4_ = (float)((uint)bVar3 * auVar28._28_4_ | (uint)!bVar3 * auVar25._28_4_);
      auVar25 = vfmsub231ps_avx512vl(auVar26,auVar29,auVar67._0_32_);
      auVar28 = vfmsub231ps_avx512vl(auVar25,auVar29,auVar68._0_32_);
      auVar12._4_4_ = auVar28._4_4_ * auVar28._4_4_;
      auVar12._0_4_ = auVar28._0_4_ * auVar28._0_4_;
      auVar12._8_4_ = auVar28._8_4_ * auVar28._8_4_;
      auVar12._12_4_ = auVar28._12_4_ * auVar28._12_4_;
      auVar12._16_4_ = auVar28._16_4_ * auVar28._16_4_;
      auVar12._20_4_ = auVar28._20_4_ * auVar28._20_4_;
      auVar12._24_4_ = auVar28._24_4_ * auVar28._24_4_;
      auVar12._28_4_ = auVar27._28_4_;
      auVar26 = vfmadd213ps_avx512vl(auVar69._0_32_,auVar28,auVar70._0_32_);
      auVar25._8_4_ = 0x3c088908;
      auVar25._0_8_ = 0x3c0889083c088908;
      auVar25._12_4_ = 0x3c088908;
      auVar25._16_4_ = 0x3c088908;
      auVar25._20_4_ = 0x3c088908;
      auVar25._24_4_ = 0x3c088908;
      auVar25._28_4_ = 0x3c088908;
      auVar25 = vfmadd213ps_avx512vl(auVar26,auVar28,auVar25);
      auVar26._8_4_ = 0x3d2aa9c1;
      auVar26._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar26._12_4_ = 0x3d2aa9c1;
      auVar26._16_4_ = 0x3d2aa9c1;
      auVar26._20_4_ = 0x3d2aa9c1;
      auVar26._24_4_ = 0x3d2aa9c1;
      auVar26._28_4_ = 0x3d2aa9c1;
      auVar25 = vfmadd213ps_avx512vl(auVar25,auVar28,auVar26);
      auVar27._8_4_ = 0x3e2aaaaa;
      auVar27._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar27._12_4_ = 0x3e2aaaaa;
      auVar27._16_4_ = 0x3e2aaaaa;
      auVar27._20_4_ = 0x3e2aaaaa;
      auVar27._24_4_ = 0x3e2aaaaa;
      auVar27._28_4_ = 0x3e2aaaaa;
      auVar25 = vfmadd213ps_avx512vl(auVar25,auVar28,auVar27);
      auVar25 = vfmadd213ps_avx512vl(auVar25,auVar28,auVar63._0_32_);
      auVar18 = vfmadd213ps_fma(auVar25,auVar12,auVar28);
      auVar25 = vaddps_avx512vl(ZEXT1632(auVar18),auVar65);
      auVar46._0_4_ = (int)auVar29._0_4_;
      auVar46._4_4_ = (int)auVar29._4_4_;
      auVar46._8_4_ = (int)auVar29._8_4_;
      auVar46._12_4_ = (int)auVar29._12_4_;
      auVar46._16_4_ = (int)auVar29._16_4_;
      auVar46._20_4_ = (int)auVar29._20_4_;
      auVar46._24_4_ = (int)auVar29._24_4_;
      auVar46._28_4_ = (int)auVar29._28_4_;
      auVar26 = vpslld_avx2(auVar46,0x17);
      auVar28._8_4_ = 0x3f800000;
      auVar28._0_8_ = 0x3f8000003f800000;
      auVar28._12_4_ = 0x3f800000;
      auVar28._16_4_ = 0x3f800000;
      auVar28._20_4_ = 0x3f800000;
      auVar28._24_4_ = 0x3f800000;
      auVar28._28_4_ = 0x3f800000;
      auVar26 = vpaddd_avx512vl(auVar26,auVar28);
      auVar26 = vfmsub213ps_avx512vl(auVar26,auVar25,auVar65);
      auVar18 = vfmadd213ps_fma(auVar26,auVar23,auVar24);
      auVar24._4_4_ = auVar18._4_4_ * fVar1;
      auVar24._0_4_ = auVar18._0_4_ * fVar1;
      auVar24._8_4_ = auVar18._8_4_ * fVar1;
      auVar24._12_4_ = auVar18._12_4_ * fVar1;
      auVar24._16_4_ = fVar1 * 0.0;
      auVar24._20_4_ = fVar1 * 0.0;
      auVar24._24_4_ = fVar1 * 0.0;
      auVar24._28_4_ = auVar25._28_4_;
      *(undefined1 (*) [32])*pauVar16 = auVar24;
      pauVar16 = (undefined1 (*) [64])(*pauVar16 + 0x20);
    }
    fVar1 = (this->super_SELU).alpha;
    auVar18._4_4_ = fVar1;
    auVar18._0_4_ = fVar1;
    auVar18._8_4_ = fVar1;
    auVar18._12_4_ = fVar1;
    fVar1 = (this->super_SELU).lambda;
    for (; iVar17 + 3 < iVar14; iVar17 = iVar17 + 4) {
      auVar43 = vmaxps_avx(*(undefined1 (*) [16])*pauVar16,ZEXT816(0) << 0x40);
      auVar22 = vminps_avx(*(undefined1 (*) [16])*pauVar16,ZEXT816(0) << 0x40);
      auVar19._8_4_ = 0x42b0c0a5;
      auVar19._0_8_ = 0x42b0c0a542b0c0a5;
      auVar19._12_4_ = 0x42b0c0a5;
      auVar19 = vminps_avx512vl(auVar22,auVar19);
      auVar22._8_4_ = 0xc2b0c0a5;
      auVar22._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar22._12_4_ = 0xc2b0c0a5;
      auVar19 = vmaxps_avx512vl(auVar19,auVar22);
      auVar50._8_4_ = 0x3f000000;
      auVar50._0_8_ = 0x3f0000003f000000;
      auVar50._12_4_ = 0x3f000000;
      auVar20._8_4_ = 0x3fb8aa3b;
      auVar20._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar20._12_4_ = 0x3fb8aa3b;
      auVar20 = vfmadd231ps_avx512vl(auVar50,auVar19,auVar20);
      auVar47._0_4_ = (int)auVar20._0_4_;
      auVar47._4_4_ = (int)auVar20._4_4_;
      auVar47._8_4_ = (int)auVar20._8_4_;
      auVar47._12_4_ = (int)auVar20._12_4_;
      auVar22 = vcvtdq2ps_avx(auVar47);
      uVar4 = vcmpps_avx512vl(auVar20,auVar22,1);
      auVar51._8_4_ = 0x3f800000;
      auVar51._0_8_ = 0x3f8000003f800000;
      auVar51._12_4_ = 0x3f800000;
      auVar20 = vsubps_avx512vl(auVar22,auVar51);
      bVar3 = (bool)((byte)uVar4 & 1);
      auVar21._0_4_ = (float)((uint)bVar3 * auVar20._0_4_ | (uint)!bVar3 * auVar22._0_4_);
      bVar3 = (bool)((byte)(uVar4 >> 1) & 1);
      auVar21._4_4_ = (float)((uint)bVar3 * auVar20._4_4_ | (uint)!bVar3 * auVar22._4_4_);
      bVar3 = (bool)((byte)(uVar4 >> 2) & 1);
      auVar21._8_4_ = (float)((uint)bVar3 * auVar20._8_4_ | (uint)!bVar3 * auVar22._8_4_);
      bVar3 = (bool)((byte)(uVar4 >> 3) & 1);
      auVar21._12_4_ = (float)((uint)bVar3 * auVar20._12_4_ | (uint)!bVar3 * auVar22._12_4_);
      auVar5._8_4_ = 0x3f318000;
      auVar5._0_8_ = 0x3f3180003f318000;
      auVar5._12_4_ = 0x3f318000;
      auVar22 = vfmsub231ps_avx512vl(auVar19,auVar21,auVar5);
      auVar6._8_4_ = 0x395e8083;
      auVar6._0_8_ = 0x395e8083395e8083;
      auVar6._12_4_ = 0x395e8083;
      auVar19 = vfmsub231ps_avx512vl(auVar22,auVar21,auVar6);
      auVar44._0_4_ = auVar19._0_4_ * auVar19._0_4_;
      auVar44._4_4_ = auVar19._4_4_ * auVar19._4_4_;
      auVar44._8_4_ = auVar19._8_4_ * auVar19._8_4_;
      auVar44._12_4_ = auVar19._12_4_ * auVar19._12_4_;
      auVar48._8_4_ = 0x39506967;
      auVar48._0_8_ = 0x3950696739506967;
      auVar48._12_4_ = 0x39506967;
      auVar7._8_4_ = 0x3ab743ce;
      auVar7._0_8_ = 0x3ab743ce3ab743ce;
      auVar7._12_4_ = 0x3ab743ce;
      auVar22 = vfmadd213ps_avx512vl(auVar48,auVar19,auVar7);
      auVar8._8_4_ = 0x3c088908;
      auVar8._0_8_ = 0x3c0889083c088908;
      auVar8._12_4_ = 0x3c088908;
      auVar22 = vfmadd213ps_avx512vl(auVar22,auVar19,auVar8);
      auVar9._8_4_ = 0x3d2aa9c1;
      auVar9._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar9._12_4_ = 0x3d2aa9c1;
      auVar22 = vfmadd213ps_avx512vl(auVar22,auVar19,auVar9);
      auVar10._8_4_ = 0x3e2aaaaa;
      auVar10._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar10._12_4_ = 0x3e2aaaaa;
      auVar22 = vfmadd213ps_avx512vl(auVar22,auVar19,auVar10);
      auVar22 = vfmadd213ps_fma(auVar22,auVar19,auVar50);
      auVar22 = vfmadd213ps_fma(auVar22,auVar44,auVar19);
      auVar42._0_4_ = auVar22._0_4_ + 1.0;
      auVar42._4_4_ = auVar22._4_4_ + 1.0;
      auVar42._8_4_ = auVar22._8_4_ + 1.0;
      auVar42._12_4_ = auVar22._12_4_ + 1.0;
      auVar45._0_4_ = (int)auVar21._0_4_;
      auVar45._4_4_ = (int)auVar21._4_4_;
      auVar45._8_4_ = (int)auVar21._8_4_;
      auVar45._12_4_ = (int)auVar21._12_4_;
      auVar22 = vpslld_avx(auVar45,0x17);
      auVar11._8_4_ = 0x3f800000;
      auVar11._0_8_ = 0x3f8000003f800000;
      auVar11._12_4_ = 0x3f800000;
      auVar22 = vpaddd_avx512vl(auVar22,auVar11);
      auVar22 = vfmsub213ps_fma(auVar22,auVar42,auVar51);
      auVar22 = vfmadd213ps_fma(auVar22,auVar18,auVar43);
      auVar43._0_4_ = auVar22._0_4_ * fVar1;
      auVar43._4_4_ = auVar22._4_4_ * fVar1;
      auVar43._8_4_ = auVar22._8_4_ * fVar1;
      auVar43._12_4_ = auVar22._12_4_ * fVar1;
      *(undefined1 (*) [16])*pauVar16 = auVar43;
      pauVar16 = (undefined1 (*) [64])(*pauVar16 + 0x10);
    }
    fVar1 = (this->super_SELU).lambda;
    fVar2 = (this->super_SELU).alpha;
    while( true ) {
      auVar18 = auVar59._0_16_;
      auVar22 = auVar60._0_16_;
      if (iVar14 <= iVar17) break;
      fVar41 = *(float *)*pauVar16;
      if (0.0 <= fVar41) {
        fVar41 = fVar41 * (this->super_SELU).lambda;
      }
      else {
        auVar34._0_4_ = expf(fVar41);
        auVar34._4_60_ = extraout_var;
        auVar23 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar70 = ZEXT3264(auVar23);
        auVar23 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar69 = ZEXT3264(auVar23);
        auVar23 = vbroadcastss_avx512vl(ZEXT416(0x395e8083));
        auVar68 = ZEXT3264(auVar23);
        auVar23 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        auVar67 = ZEXT3264(auVar23);
        auVar23 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar66 = ZEXT3264(auVar23);
        auVar23 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
        auVar64 = ZEXT3264(auVar23);
        auVar23 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar63 = ZEXT3264(auVar23);
        auVar23 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar62 = ZEXT3264(auVar23);
        auVar23 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar61 = ZEXT3264(auVar23);
        auVar22 = vxorps_avx512vl(auVar22,auVar22);
        auVar60 = ZEXT1664(auVar22);
        auVar18 = vxorps_avx512vl(auVar18,auVar18);
        auVar59 = ZEXT1664(auVar18);
        auVar33 = vbroadcastss_avx512f(ZEXT416(0xbf800000));
        auVar32 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        auVar18 = ZEXT416((uint)(fVar1 * fVar2));
        auVar18 = vfmsub213ss_fma(auVar34._0_16_,auVar18,auVar18);
        fVar41 = auVar18._0_4_;
        afVar49 = ::_ps512_1;
        afVar52 = ::_ps512_cephes_LOG2EF;
        afVar53 = ::_ps512_cephes_exp_p5;
        afVar54 = ::_ps512_cephes_exp_p0;
        afVar55 = ::_ps512_cephes_exp_p1;
        afVar56 = ::_ps512_cephes_exp_p2;
        afVar57 = ::_ps512_cephes_exp_p3;
        afVar58 = ::_ps512_cephes_exp_p4;
      }
      *(float *)*pauVar16 = fVar41;
      pauVar16 = (undefined1 (*) [64])(*pauVar16 + 4);
      iVar17 = iVar17 + 1;
    }
  }
  return 0;
}

Assistant:

int SELU_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero512 = _mm512_setzero_ps();
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        __m512 _lambda512 = _mm512_set1_ps(lambda);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);

            __m512 _pos = _mm512_max_ps(_zero512, _p);
            __m512 _neg = _mm512_min_ps(_zero512, _p);

            __m512 _blob = exp512_ps(_neg);
            _blob = _mm512_sub_ps(_blob, _one512);
            _blob = _mm512_mul_ps(_alpha512, _blob);
            _blob = _mm512_mul_ps(_lambda512, _mm512_add_ps(_pos, _blob));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero256 = _mm256_setzero_ps();
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        __m256 _lambda256 = _mm256_set1_ps(lambda);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);

            __m256 _pos = _mm256_max_ps(_zero256, _p);
            __m256 _neg = _mm256_min_ps(_zero256, _p);

            __m256 _blob = exp256_ps(_neg);
            _blob = _mm256_sub_ps(_blob, _one256);
            _blob = _mm256_mul_ps(_alpha256, _blob);
            _blob = _mm256_mul_ps(_lambda256, _mm256_add_ps(_pos, _blob));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero128 = _mm_setzero_ps();
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _alpha128 = _mm_set1_ps(alpha);
        __m128 _lambda128 = _mm_set1_ps(lambda);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);

            __m128 _pos = _mm_max_ps(_zero128, _p);
            __m128 _neg = _mm_min_ps(_zero128, _p);

            __m128 _blob = exp_ps(_neg);
            _blob = _mm_sub_ps(_blob, _one128);
            _blob = _mm_mul_ps(_alpha128, _blob);
            _blob = _mm_mul_ps(_lambda128, _mm_add_ps(_pos, _blob));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        float alphaxlambda = alpha * lambda;
        for (; i < size; i++)
        {
            // y = lambda * ( max(0, x) + min(0, alpha * (exp(x) - 1)) )
            if (*ptr < 0)
                *ptr = (expf(*ptr) - 1.f) * alphaxlambda;
            else
                *ptr = *ptr * lambda;
            ptr++;
        }
    }

    return 0;
}